

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathContainsFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlChar *pxVar1;
  xmlXPathObjectPtr value;
  int iStack_20;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 2) {
    iStack_20 = 0xc;
    goto LAB_001b39df;
  }
  if (ctxt->valueNr < 2) {
    iStack_20 = 0x17;
    goto LAB_001b39df;
  }
  if (ctxt->value != (xmlXPathObjectPtr)0x0) {
    if (ctxt->value->type != XPATH_STRING) {
      xmlXPathStringFunction(ctxt,1);
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
      goto LAB_001b39dd;
    }
    obj = xmlXPathValuePop(ctxt);
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
      xmlXPathStringFunction(ctxt,1);
    }
    obj_00 = xmlXPathValuePop(ctxt);
    if ((obj_00 != (xmlXPathObjectPtr)0x0) && (obj_00->type == XPATH_STRING)) {
      pxVar1 = xmlStrstr(obj_00->stringval,obj->stringval);
      value = xmlXPathCacheNewBoolean(ctxt,(uint)(pxVar1 != (xmlChar *)0x0));
      xmlXPathValuePush(ctxt,value);
      xmlXPathReleaseObject(ctxt->context,obj_00);
      xmlXPathReleaseObject(ctxt->context,obj);
      return;
    }
    xmlXPathReleaseObject(ctxt->context,obj_00);
    xmlXPathReleaseObject(ctxt->context,obj);
  }
LAB_001b39dd:
  iStack_20 = 0xb;
LAB_001b39df:
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathContainsFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr hay, needle;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    needle = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    hay = xmlXPathValuePop(ctxt);

    if ((hay == NULL) || (hay->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, hay);
	xmlXPathReleaseObject(ctxt->context, needle);
	XP_ERROR(XPATH_INVALID_TYPE);
    }
    if (xmlStrstr(hay->stringval, needle->stringval))
	xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 1));
    else
	xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 0));
    xmlXPathReleaseObject(ctxt->context, hay);
    xmlXPathReleaseObject(ctxt->context, needle);
}